

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_file.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::cpp::FileGenerator::GenerateTables(FileGenerator *this,Printer *printer)

{
  int iVar1;
  pointer puVar2;
  LogMessage *pLVar3;
  pointer puVar4;
  size_t aux_offset;
  long lVar5;
  size_t offset;
  ulong uVar6;
  int idx;
  vector<unsigned_long,_std::allocator<unsigned_long>_> aux_entries;
  Formatter format;
  size_t value_1;
  vector<unsigned_long,_std::allocator<unsigned_long>_> entries;
  LogFinisher local_dd;
  int local_dc;
  void *local_d8;
  iterator iStack_d0;
  unsigned_long *local_c8;
  Formatter local_c0;
  vector<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
  local_88;
  undefined1 local_68 [16];
  unsigned_long *local_58;
  
  local_c0.printer_ = printer;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::_Rb_tree(&local_c0.vars_._M_t,&(this->variables_)._M_t);
  if ((this->options_).table_driven_parsing == true) {
    Formatter::operator()<>
              (&local_c0,
               "PROTOBUF_CONSTEXPR_VAR ::$proto_ns$::internal::ParseTableField\n    const $tablename$::entries[] PROTOBUF_SECTION_VARIABLE(protodesc_cold) = {\n"
              );
    io::Printer::Indent(local_c0.printer_);
    local_68._0_8_ = (void *)0x0;
    local_68._8_8_ = (unsigned_long *)0x0;
    local_58 = (unsigned_long *)0x0;
    puVar2 = (this->message_generators_).
             super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((this->message_generators_).
        super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish == puVar2) {
LAB_00296d69:
      Formatter::operator()<>(&local_c0,"{0, 0, 0, ::$proto_ns$::internal::kInvalidMask, 0, 0},\n");
    }
    else {
      uVar6 = 0;
      lVar5 = 0;
      do {
        local_d8 = (void *)MessageGenerator::GenerateParseOffsets
                                     (puVar2[uVar6]._M_t.
                                      super___uniq_ptr_impl<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_google::protobuf::compiler::cpp::MessageGenerator_*,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>
                                      .
                                      super__Head_base<0UL,_google::protobuf::compiler::cpp::MessageGenerator_*,_false>
                                      ._M_head_impl,printer);
        if ((unsigned_long *)local_68._8_8_ == local_58) {
          std::vector<unsigned_long,std::allocator<unsigned_long>>::
          _M_realloc_insert<unsigned_long_const&>
                    ((vector<unsigned_long,std::allocator<unsigned_long>> *)local_68,
                     (iterator)local_68._8_8_,(unsigned_long *)&local_d8);
        }
        else {
          *(void **)local_68._8_8_ = local_d8;
          local_68._8_8_ = local_68._8_8_ + 8;
        }
        lVar5 = lVar5 + (long)local_d8;
        uVar6 = uVar6 + 1;
        puVar2 = (this->message_generators_).
                 super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      } while (uVar6 < (ulong)((long)(this->message_generators_).
                                     super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)puVar2 >> 3)
              );
      if (lVar5 == 0) goto LAB_00296d69;
    }
    io::Printer::Outdent(local_c0.printer_);
    Formatter::operator()<>
              (&local_c0,
               "};\n\nPROTOBUF_CONSTEXPR_VAR ::$proto_ns$::internal::AuxiliaryParseTableField\n    const $tablename$::aux[] PROTOBUF_SECTION_VARIABLE(protodesc_cold) = {\n"
              );
    io::Printer::Indent(local_c0.printer_);
    local_d8 = (void *)0x0;
    iStack_d0._M_current = (unsigned_long *)0x0;
    local_c8 = (unsigned_long *)0x0;
    puVar2 = (this->message_generators_).
             super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((this->message_generators_).
        super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish == puVar2) {
LAB_00296e31:
      Formatter::operator()<>(&local_c0,"::$proto_ns$::internal::AuxiliaryParseTableField(),\n");
    }
    else {
      uVar6 = 0;
      lVar5 = 0;
      do {
        local_88.
        super__Vector_base<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
        ._M_impl.super__Vector_impl_data._M_start =
             (pointer)MessageGenerator::GenerateParseAuxTable
                                (puVar2[uVar6]._M_t.
                                 super___uniq_ptr_impl<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_google::protobuf::compiler::cpp::MessageGenerator_*,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>
                                 .
                                 super__Head_base<0UL,_google::protobuf::compiler::cpp::MessageGenerator_*,_false>
                                 ._M_head_impl,printer);
        if (iStack_d0._M_current == local_c8) {
          std::vector<unsigned_long,std::allocator<unsigned_long>>::
          _M_realloc_insert<unsigned_long_const&>
                    ((vector<unsigned_long,std::allocator<unsigned_long>> *)&local_d8,iStack_d0,
                     (unsigned_long *)&local_88);
        }
        else {
          *iStack_d0._M_current =
               (unsigned_long)
               local_88.
               super__Vector_base<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
               ._M_impl.super__Vector_impl_data._M_start;
          iStack_d0._M_current = iStack_d0._M_current + 1;
        }
        lVar5 = lVar5 + (long)local_88.
                              super__Vector_base<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
                              ._M_impl.super__Vector_impl_data._M_start;
        uVar6 = uVar6 + 1;
        puVar2 = (this->message_generators_).
                 super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      } while (uVar6 < (ulong)((long)(this->message_generators_).
                                     super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)puVar2 >> 3)
              );
      if (lVar5 == 0) goto LAB_00296e31;
    }
    io::Printer::Outdent(local_c0.printer_);
    Formatter::operator()<>
              (&local_c0,
               "};\nPROTOBUF_CONSTEXPR_VAR ::$proto_ns$::internal::ParseTable const\n    $tablename$::schema[] PROTOBUF_SECTION_VARIABLE(protodesc_cold) = {\n"
              );
    io::Printer::Indent(local_c0.printer_);
    puVar2 = (this->message_generators_).
             super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((this->message_generators_).
        super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish == puVar2) {
LAB_00296ecb:
      Formatter::operator()<>(&local_c0,"{ nullptr, nullptr, 0, -1, -1, false },\n");
    }
    else {
      uVar6 = 0;
      aux_offset = 0;
      offset = 0;
      do {
        MessageGenerator::GenerateParseTable
                  (puVar2[uVar6]._M_t.
                   super___uniq_ptr_impl<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_google::protobuf::compiler::cpp::MessageGenerator_*,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>
                   .
                   super__Head_base<0UL,_google::protobuf::compiler::cpp::MessageGenerator_*,_false>
                   ._M_head_impl,printer,offset,aux_offset);
        offset = offset + *(long *)(local_68._0_8_ + uVar6 * 8);
        aux_offset = aux_offset + *(long *)((long)local_d8 + uVar6 * 8);
        uVar6 = uVar6 + 1;
        puVar2 = (this->message_generators_).
                 super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        puVar4 = (this->message_generators_).
                 super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      } while (uVar6 < (ulong)((long)puVar4 - (long)puVar2 >> 3));
      if (puVar2 == puVar4) goto LAB_00296ecb;
    }
    io::Printer::Outdent(local_c0.printer_);
    Formatter::operator()<>(&local_c0,"};\n\n");
    if (local_d8 != (void *)0x0) {
      operator_delete(local_d8);
    }
    if ((void *)local_68._0_8_ != (void *)0x0) {
      operator_delete((void *)local_68._0_8_);
    }
  }
  if (((this->message_generators_).
       super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start ==
       (this->message_generators_).
       super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish) ||
     ((this->options_).table_driven_serialization != true)) goto LAB_002971c3;
  Formatter::operator()<>
            (&local_c0,
             "const ::$proto_ns$::internal::FieldMetadata $tablename$::field_metadata[] = {\n");
  io::Printer::Indent(local_c0.printer_);
  local_d8 = (void *)0x0;
  iStack_d0._M_current = (unsigned_long *)0x0;
  local_c8 = (unsigned_long *)0x0;
  local_dc = 0;
  if ((this->message_generators_).
      super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      (this->message_generators_).
      super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
LAB_00296ffe:
    std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
              ((vector<int,std::allocator<int>> *)&local_d8,(iterator)iStack_d0._M_current,&local_dc
              );
  }
  else {
    uVar6 = 0;
    do {
      if (iStack_d0._M_current == local_c8) {
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                  ((vector<int,std::allocator<int>> *)&local_d8,(iterator)iStack_d0._M_current,
                   &local_dc);
      }
      else {
        *(int *)iStack_d0._M_current = local_dc;
        iStack_d0._M_current = iStack_d0._M_current + 4;
      }
      iVar1 = MessageGenerator::GenerateFieldMetadata
                        ((MessageGenerator *)
                         (this->message_generators_).
                         super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[uVar6]._M_t.
                         super___uniq_ptr_impl<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>
                         ._M_t,printer);
      local_dc = iVar1 + local_dc;
      uVar6 = uVar6 + 1;
    } while (uVar6 < (ulong)((long)(this->message_generators_).
                                   super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(this->message_generators_).
                                   super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 3));
    if (iStack_d0._M_current == local_c8) goto LAB_00296ffe;
    *(int *)iStack_d0._M_current = local_dc;
    iStack_d0._M_current = iStack_d0._M_current + 4;
  }
  io::Printer::Outdent(local_c0.printer_);
  Formatter::operator()<>
            (&local_c0,
             "};\nconst ::$proto_ns$::internal::SerializationTable $tablename$::serialization_table[] = {\n"
            );
  io::Printer::Indent(local_c0.printer_);
  local_88.
  super__Vector_base<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_88.
  super__Vector_base<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_88.
  super__Vector_base<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  FlattenMessagesInFile(this->file_,&local_88);
  puVar4 = (this->message_generators_).
           super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar2 = (this->message_generators_).
           super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if ((long)local_88.
            super__Vector_base<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)local_88.
            super__Vector_base<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
            ._M_impl.super__Vector_impl_data._M_start != (long)puVar2 - (long)puVar4) {
    internal::LogMessage::LogMessage
              ((LogMessage *)local_68,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/cpp/cpp_file.cc"
               ,999);
    pLVar3 = internal::LogMessage::operator<<
                       ((LogMessage *)local_68,
                        "CHECK failed: (calculated_order.size()) == (message_generators_.size()): ")
    ;
    internal::LogFinisher::operator=(&local_dd,pLVar3);
    internal::LogMessage::~LogMessage((LogMessage *)local_68);
    puVar4 = (this->message_generators_).
             super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    puVar2 = (this->message_generators_).
             super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  }
  if (puVar2 != puVar4) {
    lVar5 = 0;
    uVar6 = 0;
    do {
      if (*(long *)((long)local_88.
                          super__Vector_base<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
                          ._M_impl.super__Vector_impl_data._M_start + lVar5 * 2) !=
          **(long **)((long)&(puVar4->_M_t).
                             super___uniq_ptr_impl<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_google::protobuf::compiler::cpp::MessageGenerator_*,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>
                             .
                             super__Head_base<0UL,_google::protobuf::compiler::cpp::MessageGenerator_*,_false>
                             ._M_head_impl + lVar5 * 2)) {
        internal::LogMessage::LogMessage
                  ((LogMessage *)local_68,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/cpp/cpp_file.cc"
                   ,0x3e9);
        pLVar3 = internal::LogMessage::operator<<
                           ((LogMessage *)local_68,
                            "CHECK failed: (calculated_order[i]) == (message_generators_[i]->descriptor_): "
                           );
        internal::LogFinisher::operator=(&local_dd,pLVar3);
        internal::LogMessage::~LogMessage((LogMessage *)local_68);
      }
      local_68._0_4_ = *(int *)((long)local_d8 + lVar5 + 4) - *(int *)((long)local_d8 + lVar5);
      Formatter::operator()
                (&local_c0,"{$1$, $tablename$::field_metadata + $2$},\n",(int *)local_68,
                 (int *)((long)local_d8 + lVar5));
      uVar6 = uVar6 + 1;
      puVar4 = (this->message_generators_).
               super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar5 = lVar5 + 4;
    } while (uVar6 < (ulong)((long)(this->message_generators_).
                                   super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)puVar4 >> 3));
  }
  io::Printer::Outdent(local_c0.printer_);
  Formatter::operator()<>(&local_c0,"};\n\n");
  if (local_88.
      super__Vector_base<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_88.
                    super__Vector_base<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_d8 != (void *)0x0) {
    operator_delete(local_d8);
  }
LAB_002971c3:
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_c0.vars_._M_t);
  return;
}

Assistant:

void FileGenerator::GenerateTables(io::Printer* printer) {
  Formatter format(printer, variables_);
  if (options_.table_driven_parsing) {
    // TODO(ckennelly): Gate this with the same options flag to enable
    // table-driven parsing.
    format(
        "PROTOBUF_CONSTEXPR_VAR ::$proto_ns$::internal::ParseTableField\n"
        "    const $tablename$::entries[] "
        "PROTOBUF_SECTION_VARIABLE(protodesc_cold) = {\n");
    format.Indent();

    std::vector<size_t> entries;
    size_t count = 0;
    for (int i = 0; i < message_generators_.size(); i++) {
      size_t value = message_generators_[i]->GenerateParseOffsets(printer);
      entries.push_back(value);
      count += value;
    }

    // We need these arrays to exist, and MSVC does not like empty arrays.
    if (count == 0) {
      format("{0, 0, 0, ::$proto_ns$::internal::kInvalidMask, 0, 0},\n");
    }

    format.Outdent();
    format(
        "};\n"
        "\n"
        "PROTOBUF_CONSTEXPR_VAR "
        "::$proto_ns$::internal::AuxiliaryParseTableField\n"
        "    const $tablename$::aux[] "
        "PROTOBUF_SECTION_VARIABLE(protodesc_cold) = {\n");
    format.Indent();

    std::vector<size_t> aux_entries;
    count = 0;
    for (int i = 0; i < message_generators_.size(); i++) {
      size_t value = message_generators_[i]->GenerateParseAuxTable(printer);
      aux_entries.push_back(value);
      count += value;
    }

    if (count == 0) {
      format("::$proto_ns$::internal::AuxiliaryParseTableField(),\n");
    }

    format.Outdent();
    format(
        "};\n"
        "PROTOBUF_CONSTEXPR_VAR ::$proto_ns$::internal::ParseTable const\n"
        "    $tablename$::schema[] "
        "PROTOBUF_SECTION_VARIABLE(protodesc_cold) = {\n");
    format.Indent();

    size_t offset = 0;
    size_t aux_offset = 0;
    for (int i = 0; i < message_generators_.size(); i++) {
      message_generators_[i]->GenerateParseTable(printer, offset, aux_offset);
      offset += entries[i];
      aux_offset += aux_entries[i];
    }

    if (message_generators_.empty()) {
      format("{ nullptr, nullptr, 0, -1, -1, false },\n");
    }

    format.Outdent();
    format(
        "};\n"
        "\n");
  }

  if (!message_generators_.empty() && options_.table_driven_serialization) {
    format(
        "const ::$proto_ns$::internal::FieldMetadata "
        "$tablename$::field_metadata[] "
        "= {\n");
    format.Indent();
    std::vector<int> field_metadata_offsets;
    int idx = 0;
    for (int i = 0; i < message_generators_.size(); i++) {
      field_metadata_offsets.push_back(idx);
      idx += message_generators_[i]->GenerateFieldMetadata(printer);
    }
    field_metadata_offsets.push_back(idx);
    format.Outdent();
    format(
        "};\n"
        "const ::$proto_ns$::internal::SerializationTable "
        "$tablename$::serialization_table[] = {\n");
    format.Indent();
    // We rely on the order we layout the tables to match the order we
    // calculate them with FlattenMessagesInFile, so we check here that
    // these match exactly.
    std::vector<const Descriptor*> calculated_order =
        FlattenMessagesInFile(file_);
    GOOGLE_CHECK_EQ(calculated_order.size(), message_generators_.size());
    for (int i = 0; i < message_generators_.size(); i++) {
      GOOGLE_CHECK_EQ(calculated_order[i], message_generators_[i]->descriptor_);
      format("{$1$, $tablename$::field_metadata + $2$},\n",
             field_metadata_offsets[i + 1] - field_metadata_offsets[i],  // 1
             field_metadata_offsets[i]);                                 // 2
    }
    format.Outdent();
    format(
        "};\n"
        "\n");
  }
}